

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O1

void av1_idct8(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  char bit;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int8_t *piVar6;
  int32_t *input_00;
  int iVar7;
  long lVar8;
  byte bVar9;
  undefined7 in_register_00000011;
  long lVar10;
  ulong uVar11;
  int32_t iVar12;
  long lVar13;
  long lVar14;
  int32_t step [8];
  undefined8 local_78;
  undefined8 uStack_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int8_t *local_58;
  ulong local_50;
  long local_48;
  long local_40;
  int32_t *local_38;
  
  uVar11 = CONCAT71(in_register_00000011,cos_bit) & 0xffffffff;
  lVar13 = (long)(int)CONCAT71(in_register_00000011,cos_bit) * 0x100;
  *output = *input;
  output[1] = input[4];
  output[2] = input[2];
  output[3] = input[6];
  output[4] = input[1];
  output[5] = input[5];
  output[6] = input[3];
  output[7] = input[7];
  local_58 = stage_range;
  av1_range_check_buf(1,input,output,8,stage_range[1]);
  local_78 = *(undefined8 *)output;
  uStack_70 = *(undefined8 *)(output + 2);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x240);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x180);
  lVar10 = 1L << (cos_bit - 1U & 0x3f);
  bVar9 = (byte)uVar11;
  local_68 = (int)(output[4] * iVar7 + lVar10 + (long)-(iVar1 * output[7]) >> (bVar9 & 0x3f));
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1c0);
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x200);
  local_64 = (int)(output[5] * iVar2 + lVar10 + (long)-(iVar3 * output[6]) >> (bVar9 & 0x3f));
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1a0);
  local_60 = (int)(iVar3 * output[5] + lVar10 + (long)(output[6] * iVar2) >> (bVar9 & 0x3f));
  local_5c = (int)(iVar1 * output[4] + lVar10 + (long)(output[7] * iVar7) >> (bVar9 & 0x3f));
  local_50 = uVar11;
  local_38 = input;
  av1_range_check_buf(2,input,(int32_t *)&local_78,8,local_58[2]);
  input_00 = local_38;
  piVar6 = local_58;
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x1e0);
  local_40 = (long)iVar1;
  lVar8 = (int)local_78 * local_40 + lVar10;
  *output = (int32_t)(local_78._4_4_ * iVar1 + lVar8 >> (bVar9 & 0x3f));
  output[1] = (int32_t)(local_78._4_4_ * -iVar1 + lVar8 >> (bVar9 & 0x3f));
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x220);
  output[2] = (int32_t)((int)uStack_70 * iVar7 + lVar10 + (long)-(iVar4 * uStack_70._4_4_) >>
                       (bVar9 & 0x3f));
  output[3] = (int32_t)(iVar4 * (int)uStack_70 + lVar10 + (long)(uStack_70._4_4_ * iVar7) >>
                       (bVar9 & 0x3f));
  iVar7 = local_64 + local_68;
  if ('\0' < local_58[3]) {
    lVar14 = 1L << (local_58[3] - 1U & 0x3f);
    lVar13 = (long)iVar7;
    lVar8 = lVar14 + -1;
    if (lVar13 < lVar14 + -1) {
      lVar8 = lVar13;
    }
    lVar5 = -lVar14;
    if (SBORROW8(lVar13,-lVar14) == lVar13 + lVar14 < 0) {
      lVar5 = lVar8;
    }
    iVar7 = (int)lVar5;
  }
  output[4] = iVar7;
  iVar7 = local_68 - local_64;
  if ('\0' < local_58[3]) {
    lVar13 = (long)iVar7;
    lVar14 = 1L << (local_58[3] - 1U & 0x3f);
    lVar8 = lVar14 + -1;
    if (lVar13 < lVar14 + -1) {
      lVar8 = lVar13;
    }
    lVar5 = -lVar14;
    if (SBORROW8(lVar13,-lVar14) == lVar13 + lVar14 < 0) {
      lVar5 = lVar8;
    }
    iVar7 = (int)lVar5;
  }
  output[5] = iVar7;
  iVar7 = local_5c - local_60;
  if ('\0' < local_58[3]) {
    lVar13 = (long)iVar7;
    lVar14 = 1L << (local_58[3] - 1U & 0x3f);
    lVar8 = lVar14 + -1;
    if (lVar13 < lVar14 + -1) {
      lVar8 = lVar13;
    }
    lVar5 = -lVar14;
    if (SBORROW8(lVar13,-lVar14) == lVar13 + lVar14 < 0) {
      lVar5 = lVar8;
    }
    iVar7 = (int)lVar5;
  }
  output[6] = iVar7;
  iVar7 = local_5c + local_60;
  if ('\0' < local_58[3]) {
    lVar13 = (long)iVar7;
    lVar14 = 1L << (local_58[3] - 1U & 0x3f);
    lVar8 = lVar14 + -1;
    if (lVar13 < lVar14 + -1) {
      lVar8 = lVar13;
    }
    lVar5 = -lVar14;
    if (SBORROW8(lVar13,-lVar14) == lVar13 + lVar14 < 0) {
      lVar5 = lVar8;
    }
    iVar7 = (int)lVar5;
  }
  output[7] = iVar7;
  local_48 = lVar10;
  av1_range_check_buf(3,local_38,output,8,local_58[3]);
  local_78._0_4_ = output[3] + *output;
  bit = piVar6[4];
  if ('\0' < bit) {
    lVar10 = (long)(int)local_78;
    lVar13 = 1L << (bit - 1U & 0x3f);
    lVar8 = lVar13 + -1;
    if (lVar10 < lVar13 + -1) {
      lVar8 = lVar10;
    }
    lVar14 = -lVar13;
    if (SBORROW8(lVar10,-lVar13) == lVar10 + lVar13 < 0) {
      lVar14 = lVar8;
    }
    local_78._0_4_ = (int)lVar14;
  }
  local_78._4_4_ = output[2] + output[1];
  if ('\0' < bit) {
    lVar10 = (long)local_78._4_4_;
    lVar13 = 1L << (bit - 1U & 0x3f);
    lVar8 = lVar13 + -1;
    if (lVar10 < lVar13 + -1) {
      lVar8 = lVar10;
    }
    local_78._4_4_ = (int)-lVar13;
    if (SBORROW8(lVar10,-lVar13) == lVar10 + lVar13 < 0) {
      local_78._4_4_ = (int)lVar8;
    }
  }
  uStack_70._0_4_ = output[1] - output[2];
  if ('\0' < bit) {
    lVar10 = (long)(int)uStack_70;
    lVar13 = 1L << (bit - 1U & 0x3f);
    lVar8 = lVar13 + -1;
    if (lVar10 < lVar13 + -1) {
      lVar8 = lVar10;
    }
    lVar14 = -lVar13;
    if (SBORROW8(lVar10,-lVar13) == lVar10 + lVar13 < 0) {
      lVar14 = lVar8;
    }
    uStack_70._0_4_ = (int)lVar14;
  }
  uStack_70._4_4_ = *output - output[3];
  if ('\0' < bit) {
    lVar10 = (long)uStack_70._4_4_;
    lVar13 = 1L << (bit - 1U & 0x3f);
    lVar8 = lVar13 + -1;
    if (lVar10 < lVar13 + -1) {
      lVar8 = lVar10;
    }
    lVar14 = -lVar13;
    if (SBORROW8(lVar10,-lVar13) == lVar10 + lVar13 < 0) {
      lVar14 = lVar8;
    }
    uStack_70._4_4_ = (int)lVar14;
  }
  local_68 = output[4];
  lVar8 = local_48 + output[6] * local_40;
  local_64 = (int)(-iVar1 * output[5] + lVar8 >> (bVar9 & 0x3f));
  local_60 = (int)((int)local_40 * output[5] + lVar8 >> (bVar9 & 0x3f));
  local_5c = output[7];
  av1_range_check_buf(4,input_00,(int32_t *)&local_78,8,bit);
  iVar7 = local_5c + (int)local_78;
  if ('\0' < piVar6[5]) {
    lVar10 = (long)iVar7;
    lVar13 = 1L << (piVar6[5] - 1U & 0x3f);
    lVar8 = lVar13 + -1;
    if (lVar10 < lVar13 + -1) {
      lVar8 = lVar10;
    }
    lVar14 = -lVar13;
    if (SBORROW8(lVar10,-lVar13) == lVar10 + lVar13 < 0) {
      lVar14 = lVar8;
    }
    iVar7 = (int)lVar14;
  }
  *output = iVar7;
  iVar7 = local_60 + local_78._4_4_;
  if ('\0' < piVar6[5]) {
    lVar10 = (long)iVar7;
    lVar13 = 1L << (piVar6[5] - 1U & 0x3f);
    lVar8 = lVar13 + -1;
    if (lVar10 < lVar13 + -1) {
      lVar8 = lVar10;
    }
    lVar14 = -lVar13;
    if (SBORROW8(lVar10,-lVar13) == lVar10 + lVar13 < 0) {
      lVar14 = lVar8;
    }
    iVar7 = (int)lVar14;
  }
  output[1] = iVar7;
  iVar7 = local_64 + (int)uStack_70;
  if ('\0' < piVar6[5]) {
    lVar10 = (long)iVar7;
    lVar13 = 1L << (piVar6[5] - 1U & 0x3f);
    lVar8 = lVar13 + -1;
    if (lVar10 < lVar13 + -1) {
      lVar8 = lVar10;
    }
    lVar14 = -lVar13;
    if (SBORROW8(lVar10,-lVar13) == lVar10 + lVar13 < 0) {
      lVar14 = lVar8;
    }
    iVar7 = (int)lVar14;
  }
  output[2] = iVar7;
  iVar7 = local_68 + uStack_70._4_4_;
  if ('\0' < piVar6[5]) {
    lVar10 = (long)iVar7;
    lVar13 = 1L << (piVar6[5] - 1U & 0x3f);
    lVar8 = lVar13 + -1;
    if (lVar10 < lVar13 + -1) {
      lVar8 = lVar10;
    }
    lVar14 = -lVar13;
    if (SBORROW8(lVar10,-lVar13) == lVar10 + lVar13 < 0) {
      lVar14 = lVar8;
    }
    iVar7 = (int)lVar14;
  }
  output[3] = iVar7;
  local_68 = uStack_70._4_4_ - local_68;
  if ('\0' < piVar6[5]) {
    lVar10 = (long)local_68;
    lVar13 = 1L << (piVar6[5] - 1U & 0x3f);
    lVar8 = lVar13 + -1;
    if (lVar10 < lVar13 + -1) {
      lVar8 = lVar10;
    }
    lVar14 = -lVar13;
    if (SBORROW8(lVar10,-lVar13) == lVar10 + lVar13 < 0) {
      lVar14 = lVar8;
    }
    local_68 = (int)lVar14;
  }
  output[4] = local_68;
  iVar12 = (int)uStack_70 - local_64;
  if ('\0' < piVar6[5]) {
    lVar10 = (long)iVar12;
    lVar13 = 1L << (piVar6[5] - 1U & 0x3f);
    lVar8 = lVar13 + -1;
    if (lVar10 < lVar13 + -1) {
      lVar8 = lVar10;
    }
    lVar14 = -lVar13;
    if (SBORROW8(lVar10,-lVar13) == lVar10 + lVar13 < 0) {
      lVar14 = lVar8;
    }
    iVar12 = (int32_t)lVar14;
  }
  output[5] = iVar12;
  local_78._4_4_ = local_78._4_4_ - local_60;
  if ('\0' < piVar6[5]) {
    lVar10 = (long)local_78._4_4_;
    lVar13 = 1L << (piVar6[5] - 1U & 0x3f);
    lVar8 = lVar13 + -1;
    if (lVar10 < lVar13 + -1) {
      lVar8 = lVar10;
    }
    lVar14 = -lVar13;
    if (SBORROW8(lVar10,-lVar13) == lVar10 + lVar13 < 0) {
      lVar14 = lVar8;
    }
    local_78._4_4_ = (int)lVar14;
  }
  output[6] = local_78._4_4_;
  local_78._0_4_ = (int)local_78 - local_5c;
  if ('\0' < piVar6[5]) {
    lVar10 = (long)(int)local_78;
    lVar13 = 1L << (piVar6[5] - 1U & 0x3f);
    lVar8 = lVar13 + -1;
    if (lVar10 < lVar13 + -1) {
      lVar8 = lVar10;
    }
    lVar14 = -lVar13;
    if (SBORROW8(lVar10,-lVar13) == lVar10 + lVar13 < 0) {
      lVar14 = lVar8;
    }
    local_78._0_4_ = (int)lVar14;
  }
  output[7] = (int)local_78;
  return;
}

Assistant:

void av1_idct8(const int32_t *input, int32_t *output, int8_t cos_bit,
               const int8_t *stage_range) {
  assert(output != input);
  const int32_t size = 8;
  const int32_t *cospi = cospi_arr(cos_bit);

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[8];

  // stage 0;

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[0];
  bf1[1] = input[4];
  bf1[2] = input[2];
  bf1[3] = input[6];
  bf1[4] = input[1];
  bf1[5] = input[5];
  bf1[6] = input[3];
  bf1[7] = input[7];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[56], bf0[4], -cospi[8], bf0[7], cos_bit);
  bf1[5] = half_btf(cospi[24], bf0[5], -cospi[40], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[40], bf0[5], cospi[24], bf0[6], cos_bit);
  bf1[7] = half_btf(cospi[8], bf0[4], cospi[56], bf0[7], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = half_btf(cospi[32], bf0[0], cospi[32], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[32], bf0[0], -cospi[32], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[48], bf0[2], -cospi[16], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[16], bf0[2], cospi[48], bf0[3], cos_bit);
  bf1[4] = clamp_value(bf0[4] + bf0[5], stage_range[stage]);
  bf1[5] = clamp_value(bf0[4] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(-bf0[6] + bf0[7], stage_range[stage]);
  bf1[7] = clamp_value(bf0[6] + bf0[7], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = clamp_value(bf0[0] + bf0[3], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[2], stage_range[stage]);
  bf1[2] = clamp_value(bf0[1] - bf0[2], stage_range[stage]);
  bf1[3] = clamp_value(bf0[0] - bf0[3], stage_range[stage]);
  bf1[4] = bf0[4];
  bf1[5] = half_btf(-cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[6] = half_btf(cospi[32], bf0[5], cospi[32], bf0[6], cos_bit);
  bf1[7] = bf0[7];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[7], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[6], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[5], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[4], stage_range[stage]);
  bf1[4] = clamp_value(bf0[3] - bf0[4], stage_range[stage]);
  bf1[5] = clamp_value(bf0[2] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(bf0[1] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[0] - bf0[7], stage_range[stage]);
}